

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

String * __thiscall
glcts::LayoutBindingBaseCase::generateLog<tcu::RGBA,tcu::RGBA>
          (String *__return_storage_ptr__,LayoutBindingBaseCase *this,String *msg,RGBA result,
          RGBA expected)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 local_1a0 [8];
  StringStream s;
  String *msg_local;
  LayoutBindingBaseCase *this_local;
  RGBA expected_local;
  RGBA result_local;
  
  s.super_ostringstream._368_8_ = msg;
  StringStream::StringStream((StringStream *)local_1a0);
  poVar2 = std::operator<<((ostream *)local_1a0,(string *)s.super_ostringstream._368_8_);
  poVar2 = std::operator<<(poVar2," expected: ");
  poVar2 = tcu::operator<<(poVar2,expected);
  poVar2 = std::operator<<(poVar2," actual: ");
  poVar2 = tcu::operator<<(poVar2,result);
  std::operator<<(poVar2,"\n");
  iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x15])(this,0);
  poVar2 = std::operator<<((ostream *)local_1a0,(string *)CONCAT44(extraout_var,iVar1));
  std::operator<<(poVar2,"\n");
  iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x15])(this,1);
  poVar2 = std::operator<<((ostream *)local_1a0,(string *)CONCAT44(extraout_var_00,iVar1));
  std::operator<<(poVar2,"\n");
  std::__cxx11::ostringstream::str();
  StringStream::~StringStream((StringStream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

String generateLog(const String& msg, T0 result, T1 expected)
	{
		StringStream s;
		s << msg << " expected: " << expected << " actual: " << result << "\n";
		s << getSource(VertexShader) << "\n";
		s << getSource(FragmentShader) << "\n";
		return s.str();
	}